

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O3

void leccalc::doit(string *subfolder,FILE **fout,bool useReturnPeriodFile,bool skipheader,
                  bool *outputFlags,bool ordFlag,string *parquetFileNames,char *progname)

{
  _Rb_tree_color _Var1;
  iterator __position;
  bool bVar2;
  int iVar3;
  bool *outputFlags_00;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  FILE *pFVar6;
  char *pcVar7;
  vector<long_long,std::allocator<long_long>> *this;
  _Rb_tree_node_base *p_Var8;
  mapped_type *pmVar9;
  undefined8 extraout_RAX;
  undefined7 in_register_00000009;
  long lVar10;
  long lVar11;
  uint uVar12;
  pointer pbVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  uint samplesize;
  int file_index;
  int last_summary_id;
  FILE *in;
  int summary_id;
  sampleslevelRec sr;
  int totalperiods;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string s;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> fileHandles;
  summarySampleslevelHeader sh;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  indexFiles;
  longlong offset;
  vector<int,_std::allocator<int>_> fileIDs_agg;
  vector<int,_std::allocator<int>_> fileIDs_occ;
  longlong file_offset;
  set<int,_std::less<int>,_std::allocator<int>_> summaryids;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  event_to_periods;
  aggreports agg;
  string fileList;
  uint local_13d0;
  uint local_13cc;
  FILE *local_13c8;
  pointer local_13c0;
  uint local_13b8;
  int local_13b4;
  key_type local_13b0 [2];
  undefined1 local_13a0 [16];
  uint local_1390;
  int local_138c;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  local_1388;
  int local_1370;
  undefined4 local_136c;
  FILE *local_1368;
  int local_135c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1338;
  undefined1 local_1318 [32];
  _Rb_tree_node_base *local_12f8;
  size_t local_12f0;
  void *local_12e8;
  iterator iStack_12e0;
  _IO_FILE **local_12d8;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  local_12c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12a8;
  undefined1 local_1288 [16];
  pointer local_1278;
  vector<int,_std::allocator<int>_> local_1268;
  vector<int,_std::allocator<int>_> local_1248;
  long local_1230;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1228;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_11f8;
  aggreports local_11c8;
  char *local_1038 [2];
  char local_1028 [4088];
  
  local_1368 = (FILE *)CONCAT44(local_1368._4_4_,(int)CONCAT71(in_register_00000009,skipheader));
  local_13c8 = (FILE *)outputFlags;
  std::operator+(&local_1358,"work/",subfolder);
  std::__cxx11::string::substr((ulong)local_1038,(ulong)&local_1358);
  iVar3 = std::__cxx11::string::compare((char *)local_1038);
  if (local_1038[0] != local_1028) {
    operator_delete(local_1038[0]);
  }
  if (iVar3 != 0) {
    local_1038[0] = local_1028;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1038,local_1358._M_dataplus._M_p,
               local_1358._M_dataplus._M_p + local_1358._M_string_length);
    std::__cxx11::string::append((char *)local_1038);
    std::__cxx11::string::operator=((string *)&local_1358,(string *)local_1038);
    if (local_1038[0] != local_1028) {
      operator_delete(local_1038[0]);
    }
  }
  local_11f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_11f8._M_impl.super__Rb_tree_header._M_header;
  local_11f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_11f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_11f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_11f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_11f8._M_impl.super__Rb_tree_header._M_header._M_left;
  loadoccurrence((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_11f8,&local_135c);
  std::
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  ::vector(&local_1388,2,(allocator_type *)local_1038);
  local_13c0 = (pointer)CONCAT44(local_13c0._4_4_,(uint)useReturnPeriodFile);
  aggreports::aggreports
            (&local_11c8,local_135c,fout,useReturnPeriodFile,(bool *)local_13c8,ordFlag,
             parquetFileNames,progname);
  outputFlags_00 = aggreports::GetOutputFlags(&local_11c8);
  local_1248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  bVar2 = setupoutputfiles(fout,ordFlag,outputFlags_00,local_1368._0_1_,&local_1248,&local_1268,
                           &local_11c8);
  local_13b8 = CONCAT31(local_13b8._1_3_,bVar2);
  local_1338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_1338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12d8 = (_IO_FILE **)0x0;
  local_12e8 = (void *)0x0;
  iStack_12e0._M_current = (_IO_FILE **)0x0;
  local_12a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13d0 = 0;
  local_1228._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1228._M_impl.super__Rb_tree_header._M_header;
  local_1228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1228._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1228._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1228._M_impl.super__Rb_tree_header._M_header._M_left;
  if (subfolder->_M_string_length == 0) {
    processinputfile(&local_13d0,
                     (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)&local_11f8,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1228,
                     &local_1388,SUB81(local_13c0,0),&local_11c8);
LAB_0010393c:
    outputaggreports(&local_11c8,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1228,
                     &local_1388,local_13d0,&local_1248,&local_1268,SUB41(local_13b8,0));
LAB_00103972:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_1228);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_12a8);
    if (local_12e8 != (void *)0x0) {
      operator_delete(local_12e8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1338);
    if (local_1268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
    ::~_Rb_tree(&local_11c8.fileHeaders_._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_11c8.ensembletosidx_._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_11c8.periodstoweighting_._M_t);
    if (local_11c8.returnperiods_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_11c8.returnperiods_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
    ::~_Rb_tree(&local_11c8.wheatSheaf_._M_t);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_11c8.summaryids_._M_t);
    std::
    vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
    ::~vector(&local_1388);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_11f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1358._M_dataplus._M_p != &local_1358.field_2) {
      operator_delete(local_1358._M_dataplus._M_p);
    }
    return;
  }
  local_1038[0] = local_1028;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1038,local_1358._M_dataplus._M_p,
             local_1358._M_dataplus._M_p + local_1358._M_string_length);
  std::__cxx11::string::append((char *)local_1038);
  local_13c8 = fopen(local_1038[0],"w");
  if (local_13c8 == (FILE *)0x0) goto LAB_00103ad5;
  __dirp = opendir(local_1358._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    while (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0) {
      local_1318._0_8_ = local_1318 + 0x10;
      sVar5 = strlen(pdVar4->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1318,pdVar4->d_name,pdVar4->d_name + sVar5);
      if (4 < (ulong)local_1318._8_8_) {
        std::__cxx11::string::substr((ulong)local_13b0,(ulong)local_1318);
        iVar3 = std::__cxx11::string::compare((char *)local_13b0);
        if (local_13b0[0] != (key_type)local_13a0) {
          operator_delete((void *)local_13b0[0]);
        }
        if (iVar3 == 0) {
          local_13b0[0] = (key_type)local_13a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_13b0,local_1358._M_dataplus._M_p,
                     local_1358._M_dataplus._M_p + local_1358._M_string_length);
          std::__cxx11::string::append((char *)local_13b0);
          std::__cxx11::string::operator=((string *)local_1318,(string *)local_13b0);
          if (local_13b0[0] != (key_type)local_13a0) {
            operator_delete((void *)local_13b0[0]);
          }
          local_13b0[0] = (key_type)fopen((char *)local_1318._0_8_,"rb");
          if (local_13b0[0] == (key_type)0x0) goto LAB_00103ac8;
          checkinputfile(&local_13d0,(FILE *)local_13b0[0],&local_11c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1338,(value_type *)local_1318);
          if (iStack_12e0._M_current == local_12d8) {
            std::vector<_IO_FILE*,std::allocator<_IO_FILE*>>::_M_realloc_insert<_IO_FILE*const&>
                      ((vector<_IO_FILE*,std::allocator<_IO_FILE*>> *)&local_12e8,iStack_12e0,
                       (_IO_FILE **)local_13b0);
          }
          else {
            *iStack_12e0._M_current = (_IO_FILE *)local_13b0[0];
            iStack_12e0._M_current = iStack_12e0._M_current + 1;
          }
          fprintf(local_13c8,"%s\n",local_1318._0_8_);
          if ((ulong)local_1318._8_8_ < 4) goto LAB_00103ab3;
          *(char *)(local_1318._0_8_ + (local_1318._8_8_ - 4)) = '\0';
          local_1318._8_8_ = local_1318._8_8_ - 4;
          std::__cxx11::string::append((char *)local_1318);
          pFVar6 = fopen((char *)local_1318._0_8_,"r");
          if (pFVar6 != (FILE *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_12a8,(value_type *)local_1318);
            fclose(pFVar6);
          }
        }
      }
      if ((undefined1 *)local_1318._0_8_ != local_1318 + 0x10) {
        operator_delete((void *)local_1318._0_8_);
      }
    }
    fclose(local_13c8);
    if (local_1038[0] != local_1028) {
      operator_delete(local_1038[0]);
    }
    lVar10 = (long)local_1338.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1338.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar11 = (long)local_12a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_12a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (lVar10 == lVar11) {
      local_13cc = 0;
      local_1318._24_8_ = local_1318 + 8;
      local_1318._8_8_ = local_1318._8_8_ & 0xffffffff00000000;
      local_1318._16_8_ = 0;
      local_12f0 = 0;
      local_12f8 = (_Rb_tree_node_base *)local_1318._24_8_;
      if (local_12a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_12a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar13 = local_12a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_13c0 = pbVar13;
          pFVar6 = fopen((pbVar13->_M_dataplus)._M_p,"r");
          local_13b0[0].fileindex = local_13cc;
          local_13cc = local_13cc + 1;
          while (pcVar7 = fgets((char *)local_1038,0x1000,pFVar6), pcVar7 != (char *)0x0) {
            iVar3 = __isoc99_sscanf(local_1038,"%d,%lld",local_13b0,local_1288);
            if (iVar3 != 2) {
              doit();
              goto LAB_00103aa1;
            }
            this = (vector<long_long,std::allocator<long_long>> *)
                   std::
                   map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_1318,local_13b0);
            __position._M_current = *(longlong **)(this + 8);
            if (__position._M_current == *(longlong **)(this + 0x10)) {
              std::vector<long_long,std::allocator<long_long>>::_M_realloc_insert<long_long_const&>
                        (this,__position,(longlong *)local_1288);
            }
            else {
              *__position._M_current = local_1288._0_8_;
              *(longlong **)(this + 8) = __position._M_current + 1;
            }
          }
          fclose(pFVar6);
          pbVar13 = local_13c0 + 1;
        } while (pbVar13 !=
                 local_12a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_13b0[0] = (key_type)local_13a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_13b0,local_1358._M_dataplus._M_p,
                 local_1358._M_dataplus._M_p + local_1358._M_string_length);
      std::__cxx11::string::append((char *)local_13b0);
      pFVar6 = fopen((char *)local_13b0[0],"w");
      p_Var8 = (_Rb_tree_node_base *)local_1318._24_8_;
      if (pFVar6 != (FILE *)0x0) {
        for (; p_Var8 != (_Rb_tree_node_base *)(local_1318 + 8);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          for (p_Var15 = p_Var8[1]._M_parent; p_Var15 != p_Var8[1]._M_left;
              p_Var15 = (_Base_ptr)&p_Var15->_M_parent) {
            fprintf(pFVar6,"%d,%d,%lld\n",(ulong)p_Var8[1]._M_color,
                    (ulong)*(uint *)&p_Var8[1].field_0x4,*(undefined8 *)p_Var15);
          }
        }
        std::
        _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::clear((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 *)local_1318);
        fclose(pFVar6);
        local_13cc = 0;
        local_13b4 = -1;
        local_1368 = fopen((char *)local_13b0[0],"r");
        pcVar7 = fgets((char *)local_1038,0x1000,local_1368);
        local_1390 = local_13b8 & 0xff;
        if (pcVar7 != (char *)0x0) {
          uVar12 = 0xffffffff;
          local_13c8 = (FILE *)0x0;
          do {
            iVar3 = __isoc99_sscanf(local_1038,"%d,%d,%lld",&local_138c,&local_13cc,&local_1230);
            if (iVar3 != 3) goto LAB_00103aa1;
            if (local_13b4 != local_138c) {
              if (local_13b4 != -1) {
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                clear(&local_1228);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&local_1228,&local_13b4);
                outputaggreports(&local_11c8,
                                 (set<int,_std::less<int>,_std::allocator<int>_> *)&local_1228,
                                 &local_1388,local_13d0,&local_1248,&local_1268,SUB41(local_1390,0))
                ;
                std::
                vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ::vector(&local_12c8,2,(allocator_type *)&local_1370);
                local_1278 = local_1388.
                             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1288._8_8_ =
                     local_1388.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_1288._0_8_ =
                     local_1388.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_1388.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_12c8.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1388.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_12c8.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_1388.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_12c8.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_12c8.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_12c8.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_12c8.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ::~vector((vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                           *)local_1288);
                std::
                vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ::~vector(&local_12c8);
              }
              local_13b4 = local_138c;
            }
            if (uVar12 != local_13cc) {
              local_13c8 = *(FILE **)((long)local_12e8 + (long)(int)local_13cc * 8);
              uVar12 = local_13cc;
            }
            pFVar6 = local_13c8;
            if (local_13c8 != (FILE *)0x0) {
              fseek(local_13c8,local_1230,0);
              sVar5 = fread(&local_12c8,0xc,1,pFVar6);
              if (local_11f8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                p_Var15 = local_11f8._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var17 = &local_11f8._M_impl.super__Rb_tree_header._M_header;
                do {
                  p_Var16 = p_Var17;
                  p_Var14 = p_Var15;
                  _Var1 = p_Var14[1]._M_color;
                  p_Var17 = p_Var14;
                  if ((int)_Var1 <
                      (int)local_12c8.
                           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
                    p_Var17 = p_Var16;
                  }
                  p_Var15 = (&p_Var14->_M_left)
                            [(int)_Var1 <
                             (int)local_12c8.
                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start];
                } while ((&p_Var14->_M_left)
                         [(int)_Var1 <
                          (int)local_12c8.
                               super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start] != (_Base_ptr)0x0);
                if ((_Rb_tree_header *)p_Var17 != &local_11f8._M_impl.super__Rb_tree_header) {
                  if ((int)_Var1 <
                      (int)local_12c8.
                           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
                    p_Var14 = p_Var16;
                  }
                  if ((((int)p_Var14[1]._M_color <=
                        (int)local_12c8.
                             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) && (sVar5 != 0)) &&
                     (sVar5 = fread((allocator_type *)&local_1370,8,1,local_13c8),
                     local_13b8 = uVar12, local_1370 != 0 && sVar5 == 1)) {
                    do {
                      if (1 < local_1370 + 5U) {
                        local_1288._0_4_ =
                             local_12c8.
                             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_;
                        local_1288._8_4_ = local_1370;
                        p_Var15 = p_Var17[1]._M_parent;
                        p_Var14 = p_Var17[1]._M_left;
                        uVar12 = local_13b8;
                        if (p_Var15 != p_Var14) {
                          bVar2 = local_1370 != -1;
                          local_13c0 = (pointer)CONCAT44(local_13c0._4_4_,local_136c);
                          do {
                            local_1288._4_4_ = p_Var15->_M_color;
                            uVar12 = (uint)bVar2;
                            pmVar9 = std::
                                     map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                     ::operator[]((
                                                  map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                                  *)(&((local_1388.
                                                                                                                
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  _M_impl.field_0x0 + uVar12 * 0x30),
                                                  (key_type *)local_1288);
                            pmVar9->agg_out_loss = pmVar9->agg_out_loss + local_13c0._0_4_;
                            pmVar9 = std::
                                     map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                     ::operator[]((
                                                  map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                                  *)(&((local_1388.
                                                                                                                
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  _M_impl.field_0x0 + uVar12 * 0x30),
                                                  (key_type *)local_1288);
                            if (pmVar9->max_out_loss <= local_13c0._0_4_ &&
                                local_13c0._0_4_ != pmVar9->max_out_loss) {
                              pmVar9 = std::
                                       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                       ::operator[]((
                                                  map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                                  *)(&((local_1388.
                                                                                                                
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  _M_impl.field_0x0 + uVar12 * 0x30),
                                                  (key_type *)local_1288);
                              pmVar9->max_out_loss = local_13c0._0_4_;
                            }
                            p_Var15 = (_Base_ptr)&p_Var15->field_0x4;
                            uVar12 = local_13b8;
                          } while (p_Var15 != p_Var14);
                        }
                      }
                      sVar5 = fread(&local_1370,8,1,local_13c8);
                    } while ((sVar5 == 1) && (local_1370 != 0));
                  }
                }
              }
            }
            pcVar7 = fgets((char *)local_1038,0x1000,local_1368);
          } while (pcVar7 != (char *)0x0);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                  (&local_1228);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_1228,&local_13b4);
        outputaggreports(&local_11c8,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1228,
                         &local_1388,local_13d0,&local_1248,&local_1268,SUB41(local_1390,0));
        if (local_13b0[0] != (key_type)local_13a0) {
          operator_delete((void *)local_13b0[0]);
        }
        std::
        _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)local_1318);
        goto LAB_00103972;
      }
      goto LAB_00103aef;
    }
    if (local_12a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_12a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      fprintf(_stderr,"%d summary index files missing: Ignoring summary index files.\n",
              (ulong)(uint)((int)lVar11 - (int)lVar10));
    }
    if (local_1338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar13 = local_1338.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        setinputstream(pbVar13);
        processinputfile(&local_13d0,
                         (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)&local_11f8,
                         (set<int,_std::less<int>,_std::allocator<int>_> *)&local_1228,&local_1388,
                         SUB81(local_13c0,0),&local_11c8);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 !=
               local_1338.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    goto LAB_0010393c;
  }
  goto LAB_00103ae2;
LAB_00103aa1:
  doit();
LAB_00103ab3:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
LAB_00103ac8:
  doit((leccalc *)local_1318);
LAB_00103ad5:
  doit((leccalc *)local_1038);
LAB_00103ae2:
  doit((leccalc *)&local_1358);
LAB_00103aef:
  doit((leccalc *)local_13b0);
  if (local_13b0[0] != (key_type)local_13a0) {
    operator_delete((void *)local_13b0[0]);
  }
  std::
  _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)local_1318);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_12a8);
  if (local_12e8 != (void *)0x0) {
    operator_delete(local_12e8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1338);
  if (local_1268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  aggreports::~aggreports(&local_11c8);
  std::
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  ::~vector(&local_1388);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_11f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1358._M_dataplus._M_p != &local_1358.field_2) {
    operator_delete(local_1358._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void doit(const std::string &subfolder, FILE **fout,
		  const bool useReturnPeriodFile, bool skipheader,
		  bool *outputFlags, bool ordFlag,
		  const std::string *parquetFileNames,
		  const char *progname)
	{
		std::string path = "work/" + subfolder;
		if (path.substr(path.length() - 1, 1) != "/") {
			path = path + "/";
		}
		std::map<int, std::vector<int> > event_to_periods;
		int totalperiods;
		loadoccurrence(event_to_periods, totalperiods);
		std::vector<std::map<outkey2, OutLosses>> out_loss(2);

		aggreports agg(totalperiods, fout, useReturnPeriodFile,
			       outputFlags, ordFlag, parquetFileNames,
			       progname);
		outputFlags = agg.GetOutputFlags();

		std::vector<int> fileIDs_occ, fileIDs_agg;
		bool hasEPT = setupoutputfiles(fout, ordFlag, outputFlags,
					       skipheader, fileIDs_occ,
					       fileIDs_agg, agg);

		std::vector<std::string> files;
		std::vector<FILE*> fileHandles;
		std::vector<std::string> indexFiles;
		unsigned int samplesize=0;
		std::set<int> summaryids;
		if (subfolder.size() == 0) {
			processinputfile(samplesize, event_to_periods,
					 summaryids, out_loss,
					 useReturnPeriodFile, agg);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
			return;
		} else {
			// Store order of input files for future reference
			std::string fileList = path + "filelist.idx";
			FILE * flist = fopen(fileList.c_str(), "w");
			if (flist == nullptr) {
				fprintf(stderr, "FATAL: Cannot open %s\n", fileList.c_str());
				exit(EXIT_FAILURE);
			}
			DIR* dir;
			struct dirent* ent;
			if ((dir = opendir(path.c_str())) != NULL) {
				while ((ent = readdir(dir)) != NULL) {
					std::string s = ent->d_name;
					if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
						s = path + ent->d_name;
						FILE * in = fopen(s.c_str(), "rb");
						if (in != nullptr) {
							checkinputfile(samplesize, in, agg);
						} else {
							fprintf(stderr, "FATAL: Cannot open %s\n", s.c_str());
							exit(EXIT_FAILURE);
						}
						files.push_back(s);   // Build input file list
						fileHandles.push_back(in);
						fprintf(flist, "%s\n", s.c_str());
						// Check for index file
						s.erase(s.length() - 4);
						s += ".idx";
						FILE * fidx = fopen(s.c_str(), "r");
						if (fidx == nullptr) continue;
						indexFiles.push_back(s);
						fclose(fidx);
					}
				}
			}
			else {
				fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
				exit(-1);
			}
			fclose(flist);
		}

		if (files.size() == indexFiles.size()) {
			// Combine summary index files into one master summary index file
			int file_index = 0;
			char line[4096];
			std::map<summary_keyz, std::vector<long long>> summary_file_to_offset;
			for (std::vector<std::string>::iterator it = indexFiles.begin(); it != indexFiles.end(); ++it) {
				FILE * fidx = fopen(it->c_str(), "r");
				summary_keyz summaryFile;
				summaryFile.fileindex = file_index++;
				while (fgets(line, sizeof(line), fidx) != 0) {
					long long offset;
					int ret = sscanf(line, "%d,%lld", &summaryFile.summary_id, &offset);
					if (ret != 2) {
						fprintf(stderr, "FATAL: Invalid data in file %s:\n%s",
							it->c_str(), line);
						exit(-1);
					}
					summary_file_to_offset[summaryFile].push_back(offset);
				}
				fclose(fidx);
			}
			std::string summaryFile = path + "summaries.idx";
			FILE * fsummaries = fopen(summaryFile.c_str(), "w");
			if (fsummaries == nullptr) {
				fprintf(stderr, "Cannot open %s\n", summaryFile.c_str());
				exit(EXIT_FAILURE);
			}
			for (std::map<summary_keyz, std::vector<long long>>::iterator it_s = summary_file_to_offset.begin();
			     it_s != summary_file_to_offset.end(); ++it_s) {
				for(std::vector<long long>::iterator it_v = it_s->second.begin(); it_v != it_s->second.end(); ++it_v) {
					fprintf(fsummaries, "%d,%d,%lld\n", it_s->first.summary_id, it_s->first.fileindex, *it_v);
				}
			}
			summary_file_to_offset.clear();   // Recover memory
			fclose(fsummaries);

			// Read input files by summary ID using master summary index file
			int summary_id;
			file_index = 0;
			long long file_offset;
			int last_summary_id = -1;
			int last_file_index = -1;
			FILE * fidx = fopen(summaryFile.c_str(), "r");
			FILE * summary_fin = nullptr;
			while (fgets(line, sizeof(line), fidx) != 0) {
				int ret = sscanf(line, "%d,%d,%lld", &summary_id, &file_index, &file_offset);
				if (ret != 3) {
					fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", summaryFile.c_str(), line);
					exit(-1);
				}
				if (last_summary_id != summary_id) {
					if (last_summary_id != -1) {
						summaryids.clear();
						summaryids.insert(last_summary_id);
						outputaggreports(agg, summaryids, out_loss, samplesize, fileIDs_occ, fileIDs_agg, hasEPT);
						out_loss = std::vector<std::map<outkey2, OutLosses>>(2);   // Reset
						skipheader = true;   // Only print header for first summary ID if requested
					}
					last_summary_id = summary_id;
				}
				if (last_file_index != file_index) {
					summary_fin = fileHandles[file_index];
					last_file_index = file_index;
				}
				if (summary_fin != nullptr) {
					std::vector<sampleslevelRec> vrec;
					flseek(summary_fin, file_offset, SEEK_SET);
					summarySampleslevelHeader sh;
					size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
					std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
					if (iter == event_to_periods.end()) continue;   // Event not found so don't process it
					while (i != 0) {
						sampleslevelRec sr;
						i = fread(&sr, sizeof(sr), 1, summary_fin);
						if (i != 1 || sr.sidx == 0) break;
						if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
						dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
					}
				}
			}
			summaryids.clear();
			summaryids.insert(last_summary_id);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		} else {
			if (indexFiles.size() > 0) {
				fprintf(stderr, "%d summary index files missing: "
						"Ignoring summary index files.\n",
					(int)indexFiles.size() - (int)files.size());
			}
			for (std::vector<std::string>::iterator it = files.begin(); it != files.end(); ++it) {
				setinputstream(*it);
				processinputfile(samplesize, event_to_periods,
						 summaryids, out_loss,
						 useReturnPeriodFile, agg);
			}
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		}
	}